

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O2

strong_typedef<int,_libtorrent::queue_position_tag,_void> __thiscall
libtorrent::torrent_handle::
sync_call_ret<libtorrent::aux::strong_typedef<int,libtorrent::queue_position_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::queue_position_tag,void>(libtorrent::aux::torrent::*)()const>
          (torrent_handle *this,strong_typedef<int,_libtorrent::queue_position_tag,_void> def,
          offset_in_torrent_to_subr f)

{
  session_impl *ses;
  io_context *ctx;
  undefined8 uVar1;
  bool done;
  strong_typedef<int,_libtorrent::queue_position_tag,_void> r;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::torrent> t;
  bool local_8d;
  strong_typedef<int,_libtorrent::queue_position_tag,_void> local_8c;
  exception_ptr local_88;
  exception_ptr local_80;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_78;
  type_conflict3 local_68;
  
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_78,this);
  local_8c.m_val = def.m_val;
  if (local_78._M_ptr == (element_type *)0x0) {
    throw_invalid_handle();
  }
  ses = (session_impl *)((local_78._M_ptr)->super_torrent_hot_members).m_ses;
  local_68.done = &local_8d;
  local_68.ex = &local_88;
  local_88._M_exception_object = (void *)0x0;
  local_8d = false;
  ctx = ses->m_io_context;
  local_68.r = &local_8c;
  local_68.ses = ses;
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             &local_78);
  local_68.f = f;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::torrent_handle::sync_call_ret<libtorrent::aux::strong_typedef<int,libtorrent::queue_position_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::queue_position_tag,void>(libtorrent::aux::torrent::*)()const>(libtorrent::aux::strong_typedef<int,libtorrent::queue_position_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::queue_position_tag,void>(libtorrent::aux::torrent::*)()const)const::_lambda()_1_>
            (ctx,&local_68,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  aux::torrent_wait(&local_8d,ses);
  if (local_88._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    return (strong_typedef<int,_libtorrent::queue_position_tag,_void>)local_8c.m_val;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_80,&local_88);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_80);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_80);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_88);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret torrent_handle::sync_call_ret(Ret def, Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		Ret r = def;
#ifndef BOOST_NO_EXCEPTIONS
		if (!t) throw_invalid_handle();
#else
		if (!t) return r;
#endif
		auto& ses = static_cast<session_impl&>(t->session());

		// this is the flag to indicate the call has completed
		bool done = false;

		std::exception_ptr ex;
		dispatch(ses.get_context(), [=,&r,&done,&ses,&ex] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(ses.mut);
			done = true;
			ses.cond.notify_all();
		} );

		aux::torrent_wait(done, ses);

		if (ex) std::rethrow_exception(ex);
		return r;
	}